

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void anon_unknown.dwarf_2c1df::printFilename(OstreamBuffer *out,string *path)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t in_RCX;
  ulong in_RSI;
  OstreamBuffer *in_RDI;
  size_t i;
  long local_18;
  
  local_18 = std::__cxx11::string::size();
  while (((local_18 != 0 &&
          (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 != '/')) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 != '\\'))) {
    local_18 = local_18 + -1;
  }
  iVar1 = std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  binlog::detail::OstreamBuffer::write
            (in_RDI,iVar1 + (int)local_18,(void *)(lVar3 - local_18),in_RCX);
  return;
}

Assistant:

void printFilename(binlog::detail::OstreamBuffer& out, const std::string& path)
{
  std::size_t i = path.size();
  while (i != 0)
  {
    if (path[i-1] == '/' || path[i-1] == '\\') { break; }
    --i;
  }
  out.write(path.data() + i, path.size() - i);
}